

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_explore(command *cmd)

{
  loc_conflict grid_00;
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  loc_conflict lVar5;
  square_conflict *psVar6;
  monster *mon_00;
  monster *mon;
  wchar_t m_idx;
  loc_conflict grid;
  wchar_t x;
  wchar_t y;
  _Bool visible_monster;
  command *cmd_local;
  
  bVar2 = false;
  if (player->timed[4] == 0) {
    lVar5.x = (player->grid).x;
    lVar5.y = (player->grid).y;
    _Var3 = square_iswebbed((chunk *)cave,lVar5);
    if (_Var3) {
      msg("You clear the web.");
      grid_00.x = (player->grid).x;
      grid_00.y = (player->grid).y;
      square_destroy_trap((chunk *)cave,grid_00);
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
    else {
      grid.y = L'\0';
      while( true ) {
        bVar1 = false;
        if (grid.y < cave->height) {
          bVar1 = (bool)(bVar2 ^ 1);
        }
        if (!bVar1) break;
        for (grid.x = L'\0'; grid.x < cave->width; grid.x = grid.x + L'\x01') {
          lVar5 = (loc_conflict)loc(grid.x,grid.y);
          _Var3 = loc_eq((loc)lVar5,player->grid);
          if ((!_Var3) && (_Var3 = square_isoccupied((chunk *)cave,lVar5), _Var3)) {
            psVar6 = square((chunk *)cave,lVar5);
            mon_00 = (monster *)cave_monster(cave,(int)psVar6->mon);
            _Var3 = monster_is_obvious(mon_00);
            if (_Var3) {
              bVar2 = true;
              break;
            }
          }
        }
        grid.y = grid.y + L'\x01';
      }
      if (bVar2) {
        msg("Something is here.");
      }
      else {
        if (player->upkeep->steps != (int16_t *)0x0) {
          __assert_fail("!player->upkeep->steps",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                        ,0x61d,"void do_cmd_explore(struct command *)");
        }
        wVar4 = path_nearest_unknown
                          (player,player->grid,&player->upkeep->path_dest,&player->upkeep->steps);
        player->upkeep->step_count = wVar4;
        if (player->upkeep->step_count < L'\x01') {
          msg("No apparent path for exploration.");
        }
        else {
          player->upkeep->running = player->upkeep->step_count;
          player->upkeep->update = player->upkeep->update | 2;
          run_step(L'\0');
        }
      }
    }
  }
  else {
    msg("You cannot explore while confused.");
  }
  return;
}

Assistant:

void do_cmd_explore(struct command *cmd)
{
	bool visible_monster = false;
	/* cancel if confused */
	if (player->timed[TMD_CONFUSED]) {
		msg("You cannot explore while confused.");
	   	return;
	}


	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		msg("You clear the web.");
		square_destroy_trap(cave, player->grid);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}
	

	/* Screen for visible monsters */
	for (int y = 0; y < cave->height && !visible_monster; y++) {
		for (int x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);
			
			if (loc_eq(grid, player->grid)) continue;

			if (square_isoccupied(cave, grid)) {
				int m_idx = square(cave, grid)->mon;
				struct monster *mon = cave_monster(cave, m_idx);
				if (monster_is_obvious(mon)) {
					visible_monster = true;
					break; /* only breaks the inner loop */
				}
			}
		}
	}

	if (visible_monster) {
		msg("Something is here.");
		return;
	}

	assert(!player->upkeep->steps);
	player->upkeep->step_count = path_nearest_unknown(player, player->grid,
		&player->upkeep->path_dest, &player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
		return;
	}

	msg("No apparent path for exploration.");
}